

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall
t_ocaml_generator::generate_ocaml_struct_writer
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  long lVar2;
  t_field *tmember;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  t_ocaml_generator *ptVar9;
  pointer pptVar10;
  string _v;
  string mname;
  string name;
  string f;
  string str;
  undefined1 local_178 [17];
  undefined7 uStack_167;
  undefined8 uStack_160;
  string local_158;
  string local_138;
  t_struct *local_118;
  t_ocaml_generator *local_110;
  size_type local_108;
  undefined1 local_100 [16];
  string local_f0;
  char *local_d0;
  t_program *local_c8;
  char local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  string local_50;
  
  local_118 = tstruct;
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_d0 = local_c0;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,lVar2,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar2);
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_str","");
  t_generator::tmp(&local_50,(t_generator *)this,(string *)&local_90);
  if ((char *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  local_b0._M_allocated_capacity = (size_type)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"_f","");
  t_generator::tmp((string *)&local_70,(t_generator *)this,(string *)&local_b0);
  if ((char *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"method write (oprot : Protocol.t) =",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot#writeStructBegin \"",0x18);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,(long)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\";",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar10 = (local_118->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar10 !=
      (local_118->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      tmember = *pptVar10;
      pcVar3 = (tmember->name_)._M_dataplus._M_p;
      local_110 = (t_ocaml_generator *)local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (tmember->name_)._M_string_length);
      ptVar9 = local_110;
      iVar5 = tolower((int)*(char *)&(local_110->super_t_oop_generator).super_t_generator.
                                     _vptr_t_generator);
      *(char *)&(ptVar9->super_t_oop_generator).super_t_generator._vptr_t_generator = (char)iVar5;
      local_178._0_8_ = local_178 + 0x10;
      if (local_110 == (t_ocaml_generator *)local_100) {
        uStack_160 = local_100._8_8_;
      }
      else {
        local_178._0_8_ = local_110;
      }
      uStack_167 = local_100._1_7_;
      local_178[0x10] = local_100[0];
      local_178._8_8_ = local_108;
      local_108 = 0;
      local_100[0] = 0;
      local_110 = (t_ocaml_generator *)local_100;
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x391c06);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138.field_2._8_8_ = plVar7[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_138._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((t_ocaml_generator *)local_178._0_8_ != (t_ocaml_generator *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_);
      }
      ptVar9 = local_110;
      if (local_110 != (t_ocaml_generator *)local_100) {
        operator_delete(local_110);
      }
      local_178._0_8_ = local_178 + 0x10;
      local_178._8_8_ = (char *)0x0;
      stack0xfffffffffffffe98 = stack0xfffffffffffffe98 & 0xffffffffffffff00;
      if (tmember->value_ == (t_const_value *)0x0) {
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(match ",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," with ",6);
        if (tmember->req_ == T_REQUIRED) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"| None -> raise (Field_empty \"",0x1e);
          type_name_abi_cxx11_(&local_158,this,&local_118->super_t_type);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"| Some _v -> ",0xd);
        }
        else {
          ptVar9 = (t_ocaml_generator *)out;
          std::__ostream_insert<char,std::char_traits<char>>(out,"None -> ()",10);
          bVar4 = struct_member_default_cheaply_comparable(ptVar9,tmember);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(out," | Some ",8);
            render_const_value_abi_cxx11_(&local_158,this,tmember->type_,tmember->value_);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,local_158._M_dataplus._M_p,local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ()",6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(out," | Some _v -> ",0xe);
          poVar6 = out;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        std::__cxx11::string::_M_replace((ulong)local_178,0,(char *)local_178._8_8_,0x39faca);
      }
      else {
        if (tmember->req_ != T_REQUIRED) {
          bVar4 = struct_member_default_cheaply_comparable(ptVar9,tmember);
          if (bVar4) {
            std::__cxx11::string::_M_replace((ulong)local_178,0,(char *)local_178._8_8_,0x39faca);
            poVar6 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(match ",7);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," with ",6);
            render_const_value_abi_cxx11_(&local_158,this,tmember->type_,tmember->value_);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> () | ",9);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_178._0_8_,local_178._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p);
            }
            goto LAB_002de2fc;
          }
        }
        std::__cxx11::string::_M_assign((string *)local_178);
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
LAB_002de2fc:
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot#writeFieldBegin(\"",0x17);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(tmember->name_)._M_dataplus._M_p,(tmember->name_)._M_string_length
                         );
      ptVar9 = (t_ocaml_generator *)0x37b511;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\",",2);
      type_to_enum_abi_cxx11_(&local_158,ptVar9,tmember->type_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,tmember->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_178._0_8_,(char *)(local_178._8_8_ + local_178._0_8_));
      generate_serialize_field(this,out,tmember,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot#writeFieldEnd",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      pptVar10 = pptVar10 + 1;
    } while (pptVar10 !=
             (local_118->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot#writeFieldStop;",0x15);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_((string *)local_178,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_178._0_8_,local_178._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"oprot#writeStructEnd",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  if ((char *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  string str = tmp("_str");
  string f = tmp("_f");

  indent(out) << "method write (oprot : Protocol.t) =" << endl;
  indent_up();
  indent(out) << "oprot#writeStructBegin \"" << name << "\";" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* tmember = (*f_iter);
    string mname = "_" + decapitalize(tmember->get_name());
    string _v;

    if (struct_member_persistent(tmember)) {

      if (struct_member_omitable(tmember) && struct_member_default_cheaply_comparable(tmember)) {
        _v = "_v";
        // Avoid redundant encoding of members having default values.
        indent(out) << "(match " << mname << " with "
                    << render_const_value(tmember->get_type(), tmember->get_value()) << " -> () | "
                    << _v << " -> " << endl;
      } else {
        _v = mname;
        indent(out) << "(" << endl;
      }

    } else {

      indent(out) << "(match " << mname << " with ";

      if (struct_member_omitable(tmember)) {
        out << "None -> ()";

        if (struct_member_default_cheaply_comparable(tmember)) {
          // Avoid redundant encoding of members having default values.
          out << " | Some " << render_const_value(tmember->get_type(), tmember->get_value())
              << " -> ()";
        }
        out << " | Some _v -> " << endl;
      } else {
        out << endl;
        indent(out) << "| None -> raise (Field_empty \"" << type_name(tstruct) << "." << mname
                    << "\")" << endl;
        indent(out) << "| Some _v -> " << endl;
      }

      _v = "_v";
    }
    indent_up();
    // Write field header
    indent(out) << "oprot#writeFieldBegin(\"" << tmember->get_name() << "\","
                << type_to_enum(tmember->get_type()) << "," << tmember->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, tmember, _v);

    // Write field closer
    indent(out) << "oprot#writeFieldEnd" << endl;

    indent_down();
    indent(out) << ");" << endl;
  }

  // Write the struct map
  out << indent() << "oprot#writeFieldStop;" << endl << indent() << "oprot#writeStructEnd" << endl;

  indent_down();
}